

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

Normalizer2 * icu_63::Normalizer2Factory::getNoopInstance(UErrorCode *errorCode)

{
  UBool UVar1;
  size_t in_RSI;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (Normalizer2 *)0x0;
  }
  if ((noopInitOnce != 2) &&
     (UVar1 = umtx_initImplPreInit((UInitOnce *)&noopInitOnce), UVar1 != '\0')) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      noopSingleton = (Normalizer2 *)UMemory::operator_new((UMemory *)0x8,in_RSI);
      if (noopSingleton == (Normalizer2 *)0x0) {
        noopSingleton = (Normalizer2 *)0x0;
      }
      else {
        (noopSingleton->super_UObject)._vptr_UObject = (_func_int **)&PTR__NoopNormalizer2_0024c968;
      }
      if (noopSingleton == (Normalizer2 *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        ucln_common_registerCleanup_63(UCLN_COMMON_NORMALIZER2,uprv_normalizer2_cleanup);
      }
    }
    DAT_0025768c = *errorCode;
    umtx_initImplPostInit((UInitOnce *)&noopInitOnce);
    return noopSingleton;
  }
  if (U_ZERO_ERROR < DAT_0025768c) {
    *errorCode = DAT_0025768c;
  }
  return noopSingleton;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }